

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.h
# Opt level: O0

void __thiscall QRect::QRect(QRect *this)

{
  QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
  *in_RDI;
  
  QtPrivate::QCheckedIntegers::
  QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
  ::QCheckedInt(in_RDI,0);
  QtPrivate::QCheckedIntegers::
  QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
  ::QCheckedInt(in_RDI + 1,0);
  QtPrivate::QCheckedIntegers::
  QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
  ::QCheckedInt(in_RDI + 2,-1);
  QtPrivate::QCheckedIntegers::
  QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
  ::QCheckedInt(in_RDI + 3,-1);
  return;
}

Assistant:

constexpr QRect(const QPoint &topleft, const QPoint &bottomright) noexcept;
    constexpr QRect(const QPoint &topleft, const QSize &size) noexcept;
    constexpr QRect(int left, int top, int width, int height) noexcept;

    constexpr inline bool isNull() const noexcept;
    constexpr inline bool isEmpty() const noexcept;
    constexpr inline bool isValid() const noexcept;

    constexpr inline int left() const noexcept;
    constexpr inline int top() const noexcept;
    constexpr inline int right() const noexcept;
    constexpr inline int bottom() const noexcept;
    [[nodiscard]] QRect normalized() const noexcept;

    constexpr inline int x() const noexcept;
    constexpr inline int y() const noexcept;
    constexpr inline void setLeft(int pos) noexcept;
    constexpr inline void setTop(int pos) noexcept;
    constexpr inline void setRight(int pos) noexcept;
    constexpr inline void setBottom(int pos) noexcept;
    constexpr inline void setX(int x) noexcept;
    constexpr inline void setY(int y) noexcept;

    constexpr inline void setTopLeft(const QPoint &p) noexcept;
    constexpr inline void setBottomRight(const QPoint &p) noexcept;
    constexpr inline void setTopRight(const QPoint &p) noexcept;
    constexpr inline void setBottomLeft(const QPoint &p) noexcept;

    constexpr inline QPoint topLeft() const noexcept;
    constexpr inline QPoint bottomRight() const noexcept;
    constexpr inline QPoint topRight() const noexcept;
    constexpr inline QPoint bottomLeft() const noexcept;
    constexpr inline QPoint center() const noexcept;

    constexpr inline void moveLeft(int pos) noexcept;
    constexpr inline void moveTop(int pos) noexcept;
    constexpr inline void moveRight(int pos) noexcept;
    constexpr inline void moveBottom(int pos) noexcept;
    constexpr inline void moveTopLeft(const QPoint &p) noexcept;
    constexpr inline void moveBottomRight(const QPoint &p) noexcept;
    constexpr inline void moveTopRight(const QPoint &p) noexcept;
    constexpr inline void moveBottomLeft(const QPoint &p) noexcept;
    constexpr inline void moveCenter(const QPoint &p) noexcept;

    constexpr inline void translate(int dx, int dy) noexcept;
    constexpr inline void translate(const QPoint &p) noexcept;
    [[nodiscard]] constexpr inline QRect translated(int dx, int dy) const noexcept;
    [[nodiscard]] constexpr inline QRect translated(const QPoint &p) const noexcept;
    [[nodiscard]] constexpr inline QRect transposed() const noexcept;

    constexpr inline void moveTo(int x, int t) noexcept;
    constexpr inline void moveTo(const QPoint &p) noexcept;

    constexpr inline void setRect(int x, int y, int w, int h) noexcept;
    constexpr inline void getRect(int *x, int *y, int *w, int *h) const;

    constexpr inline void setCoords(int x1, int y1, int x2, int y2) noexcept;
    constexpr inline void getCoords(int *x1, int *y1, int *x2, int *y2) const;

    constexpr inline void adjust(int x1, int y1, int x2, int y2) noexcept;
    [[nodiscard]] constexpr inline QRect adjusted(int x1, int y1, int x2, int y2) const noexcept;

    constexpr inline QSize size() const noexcept;
    constexpr inline int width() const noexcept;
    constexpr inline int height() const noexcept;
    constexpr inline void setWidth(int w) noexcept;
    constexpr inline void setHeight(int h) noexcept;
    constexpr inline void setSize(const QSize &s) noexcept;

    QRect operator|(const QRect &r) const noexcept;
    QRect operator&(const QRect &r) const noexcept;
    inline QRect &operator|=(const QRect &r) noexcept;
    inline QRect &operator&=(const QRect &r) noexcept;

    bool contains(const QRect &r, bool proper = false) const noexcept;
    bool contains(const QPoint &p, bool proper = false) const noexcept;
    inline bool contains(int x, int y) const noexcept;
    inline bool contains(int x, int y, bool proper) const noexcept;
    [[nodiscard]] inline QRect united(const QRect &other) const noexcept;
    [[nodiscard]] inline QRect intersected(const QRect &other) const noexcept;
    bool intersects(const QRect &r) const noexcept;

    constexpr inline QRect marginsAdded(const QMargins &margins) const noexcept;
    constexpr inline QRect marginsRemoved(const QMargins &margins) const noexcept;
    constexpr inline QRect &operator+=(const QMargins &margins) noexcept;
    constexpr inline QRect &operator-=(const QMargins &margins) noexcept;

    [[nodiscard]] static constexpr inline QRect span(const QPoint &p1, const QPoint &p2) noexcept;

private:
    friend constexpr bool comparesEqual(const QRect &r1, const QRect &r2) noexcept
    { return r1.x1==r2.x1 && r1.x2==r2.x2 && r1.y1==r2.y1 && r1.y2==r2.y2; }
    Q_DECLARE_EQUALITY_COMPARABLE_LITERAL_TYPE(QRect)
    friend constexpr inline size_t qHash(const QRect &, size_t) noexcept;

public:
#if defined(Q_OS_DARWIN) || defined(Q_QDOC)
    [[nodiscard]] CGRect toCGRect() const noexcept;
#endif
    [[nodiscard]] constexpr inline QRectF toRectF() const noexcept;

private:
    using Representation = QtPrivate::QCheckedIntegers::QCheckedInt<int>;

    constexpr QRect(Representation aleft,
                    Representation atop,
                    Representation awidth,
                    Representation aheight) noexcept
        : x1(aleft), y1(atop),
          x2(aleft + awidth - 1), y2(atop + aheight - 1)
    {}